

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O0

ER __thiscall
slang::ast::ConditionalStatement::evalImpl(ConditionalStatement *this,EvalContext *context)

{
  SourceRange range;
  string_view arg;
  SourceRange range_00;
  SourceRange range_01;
  bool bVar1;
  size_type sVar2;
  SourceLocation SVar3;
  Diagnostic *pDVar4;
  Statement *this_00;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  Diagnostic *diag_1;
  bool unique;
  Diagnostic *diag;
  EvalConditionalVisitor visitor;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  EvalConditionalVisitor *in_stack_fffffffffffffea0;
  EvalConditionalVisitor *in_stack_fffffffffffffea8;
  Statement *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffed4;
  DiagCode noteCode;
  EvalContext *in_stack_fffffffffffffee8;
  SourceLocation in_stack_fffffffffffffef0;
  DiagCode code;
  undefined1 local_68 [8];
  SmallVectorBase<const_slang::ast::Statement_*> local_60 [2];
  byte local_20;
  SourceLocation local_18;
  ER local_4;
  
  code = SUB84((ulong)local_68 >> 0x20,0);
  local_18 = in_RSI;
  EvalConditionalVisitor::EvalConditionalVisitor
            (in_stack_fffffffffffffea0,
             (EvalContext *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  Statement::visit<slang::ast::EvalConditionalVisitor&>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if ((local_20 & 1) == 0) {
    bVar1 = SmallVectorBase<const_slang::ast::Statement_*>::empty(local_60);
    if (bVar1) {
      if ((*(int *)((long)in_RDI + 0x40) == 3) || (*(int *)((long)in_RDI + 0x40) == 1)) {
        std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>::back
                  ((span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>
                    *)in_stack_fffffffffffffea0);
        SVar3 = (SourceLocation)
                not_null<const_slang::ast::Expression_*>::operator->
                          ((not_null<const_slang::ast::Expression_*> *)0xa3227c);
        range_00.endLoc = in_RDI;
        range_00.startLoc = SVar3;
        pDVar4 = EvalContext::addDiag((EvalContext *)local_18,code,range_00);
        if (*(int *)((long)in_RDI + 0x40) == 3) {
          sv((char *)in_stack_fffffffffffffea0,
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        }
        else {
          sv((char *)in_stack_fffffffffffffea0,
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        }
        arg._M_str = (char *)SVar3;
        arg._M_len = (size_t)local_18;
        Diagnostic::operator<<(pDVar4,arg);
      }
      local_4 = Success;
    }
    else {
      noteCode._0_3_ = SUB43(in_stack_fffffffffffffed4,0);
      noteCode.code._1_1_ = 1;
      if (*(int *)((long)in_RDI + 0x40) != 1) {
        noteCode.code._1_1_ = *(int *)((long)in_RDI + 0x40) == 2;
      }
      if (noteCode.code._1_1_ != '\0') {
        sVar2 = SmallVectorBase<const_slang::ast::Statement_*>::size(local_60);
        if (1 < sVar2) {
          SVar3 = (SourceLocation)
                  SmallVectorBase<const_slang::ast::Statement_*>::operator[](local_60,1);
          range_01.endLoc = in_RDI;
          range_01.startLoc = in_stack_fffffffffffffef0;
          pDVar4 = EvalContext::addDiag(in_stack_fffffffffffffee8,code,range_01);
          SmallVectorBase<const_slang::ast::Statement_*>::operator[](local_60,0);
          range.endLoc = SVar3;
          range.startLoc = local_18;
          Diagnostic::addNote(pDVar4,noteCode,range);
        }
      }
      this_00 = (Statement *)SmallVectorBase<const_slang::ast::Statement_*>::operator[](local_60,0);
      local_4 = Statement::eval(this_00,(EvalContext *)
                                        CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98
                                                ));
    }
  }
  else {
    local_4 = Fail;
  }
  EvalConditionalVisitor::~EvalConditionalVisitor((EvalConditionalVisitor *)0xa324e5);
  return local_4;
}

Assistant:

ER ConditionalStatement::evalImpl(EvalContext& context) const {
    EvalConditionalVisitor visitor(context);
    this->visit(visitor);
    if (visitor.bad)
        return ER::Fail;

    if (visitor.items.empty()) {
        if (check == UniquePriorityCheck::Priority || check == UniquePriorityCheck::Unique) {
            auto& diag = context.addDiag(diag::ConstEvalNoIfItemsMatched,
                                         conditions.back().expr->sourceRange);
            diag << (check == UniquePriorityCheck::Priority ? "priority"sv : "unique"sv);
        }
        return ER::Success;
    }

    bool unique = check == UniquePriorityCheck::Unique || check == UniquePriorityCheck::Unique0;
    if (unique && visitor.items.size() > 1) {
        auto& diag = context.addDiag(diag::ConstEvalIfItemsNotUnique,
                                     visitor.items[1]->sourceRange);
        diag.addNote(diag::NotePreviousMatch, visitor.items[0]->sourceRange);
    }

    return visitor.items[0]->eval(context);
}